

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O0

void extent_heap_insert(extent_heap_t *ph,extent_t *phn)

{
  long in_RSI;
  long *in_RDI;
  
  memset((void *)(in_RSI + 0x28),0,0x18);
  if (*in_RDI == 0) {
    *in_RDI = in_RSI;
  }
  else {
    *(undefined8 *)(in_RSI + 0x30) = *(undefined8 *)(*in_RDI + 0x30);
    if (*(long *)(*in_RDI + 0x30) != 0) {
      *(long *)(*(long *)(*in_RDI + 0x30) + 0x28) = in_RSI;
    }
    *(long *)(in_RSI + 0x28) = *in_RDI;
    *(long *)(*in_RDI + 0x30) = in_RSI;
  }
  return;
}

Assistant:

bool
extents_init(tsdn_t *tsdn, extents_t *extents, extent_state_t state,
    bool delay_coalesce) {
	if (malloc_mutex_init(&extents->mtx, "extents", WITNESS_RANK_EXTENTS,
	    malloc_mutex_rank_exclusive)) {
		return true;
	}
	for (unsigned i = 0; i < SC_NPSIZES + 1; i++) {
		extent_heap_new(&extents->heaps[i]);
	}
	bitmap_init(extents->bitmap, &extents_bitmap_info, true);
	extent_list_init(&extents->lru);
	atomic_store_zu(&extents->npages, 0, ATOMIC_RELAXED);
	extents->state = state;
	extents->delay_coalesce = delay_coalesce;
	return false;
}